

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup_p.h
# Opt level: O3

QString * __thiscall
QDnsLookupRunnable::decodeLabel<QLatin1String>
          (QString *__return_storage_ptr__,QDnsLookupRunnable *this,QLatin1String encodedLabel)

{
  int *piVar1;
  QDnsLookupRunnable *pQVar2;
  char *__s;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  long local_20;
  
  __s = (char *)encodedLabel.m_size;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QDnsLookupRunnable *)0x0;
  if (0 < (long)this) {
    pQVar2 = this;
  }
  if (__s == (char *)0x0) {
    pQVar2 = (QDnsLookupRunnable *)0x0;
  }
  if (__s != (char *)0x0 && (long)this < 0) {
    pQVar2 = (QDnsLookupRunnable *)strlen(__s);
  }
  QVar3.m_data = (storage_type *)pQVar2;
  QVar3.m_size = (qsizetype)&local_38;
  QString::fromLatin1(QVar3);
  local_58 = local_38;
  uStack_54 = uStack_34;
  uStack_50 = uStack_30;
  uStack_4c = uStack_2c;
  local_48 = local_28;
  qt_ACE_do(__return_storage_ptr__,&local_58,1,1,0);
  piVar1 = (int *)CONCAT44(uStack_54,local_58);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_54,local_58),2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QString decodeLabel(T encodedLabel)
    {
        return qt_ACE_do(encodedLabel.toString(), NormalizeAce, ForbidLeadingDot);
    }